

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O3

SimpleWaveHeader * __thiscall
ASDCP::Wav::SimpleWaveHeader::ReadFromFile
          (SimpleWaveHeader *this,IFileReader *InFile,ui32_t *data_start)

{
  int iVar1;
  ui32_t read_count;
  ui32_t local_data_start;
  FrameBuffer TmpBuffer;
  uint local_d4;
  IFileReader *local_d0;
  undefined4 local_c4;
  FrameBuffer local_c0;
  SimpleWaveHeader local_98 [4];
  
  local_d4 = 0;
  local_c4 = 0;
  local_d0 = InFile;
  PCM::FrameBuffer::FrameBuffer((FrameBuffer *)&local_c0,0x8000);
  (**(code **)(*(long *)data_start + 0x38))
            (this,data_start,local_c0.m_Data,local_c0.m_Capacity,&local_d4);
  iVar1._0_2_ = this->format;
  iVar1._2_2_ = this->nchannels;
  if (-1 < iVar1) {
    ReadFromBuffer(local_98,(byte_t *)local_d0,(ui32_t)local_c0.m_Data,(ui32_t *)(ulong)local_d4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
  }
  FrameBuffer::~FrameBuffer(&local_c0);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::Wav::SimpleWaveHeader::ReadFromFile(const Kumu::IFileReader& InFile, ui32_t* data_start)
{
  ui32_t read_count = 0;
  ui32_t local_data_start = 0;
  ASDCP::PCM::FrameBuffer TmpBuffer(MaxWavHeader);

  if ( data_start == 0 )
    data_start = &local_data_start;

  Result_t result = InFile.Read(TmpBuffer.Data(), TmpBuffer.Capacity(), &read_count);

  if ( ASDCP_SUCCESS(result) )
    result = ReadFromBuffer(TmpBuffer.RoData(), read_count, data_start);

  return result;
}